

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3OpenTableAndIndices(Parse *pParse,Table *pTab,int baseCur,int op)

{
  Index *pIdx;
  int iVar1;
  Vdbe *p;
  KeyInfo *zP4;
  int iVar2;
  Index **ppIVar3;
  
  iVar2 = 0;
  if ((pTab->tabFlags & 0x10) == 0) {
    iVar1 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    p = sqlite3GetVdbe(pParse);
    sqlite3OpenTable(pParse,baseCur,iVar1,pTab,op);
    iVar2 = 0;
    ppIVar3 = &pTab->pIndex;
    while (pIdx = *ppIVar3, pIdx != (Index *)0x0) {
      zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
      sqlite3VdbeAddOp4(p,op,baseCur + 1 + iVar2,pIdx->tnum,iVar1,(char *)zP4,-0x10);
      iVar2 = iVar2 + 1;
      ppIVar3 = &pIdx->pNext;
    }
    iVar1 = baseCur + iVar2 + 1;
    if (pParse->nTab < iVar1) {
      pParse->nTab = iVar1;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int baseCur,     /* Cursor number assigned to the table */
  int op           /* OP_OpenRead or OP_OpenWrite */
){
  int i;
  int iDb;
  Index *pIdx;
  Vdbe *v;

  if( IsVirtual(pTab) ) return 0;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3OpenTable(pParse, baseCur, iDb, pTab, op);
  for(i=1, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
    assert( pIdx->pSchema==pTab->pSchema );
    sqlite3VdbeAddOp4(v, op, i+baseCur, pIdx->tnum, iDb,
                      (char*)pKey, P4_KEYINFO_HANDOFF);
    VdbeComment((v, "%s", pIdx->zName));
  }
  if( pParse->nTab<baseCur+i ){
    pParse->nTab = baseCur+i;
  }
  return i-1;
}